

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

bool __thiscall
duckdb::BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *this)

{
  bool bVar1;
  byte width;
  byte bVar2;
  bitpacking_width_t width_00;
  idx_t iVar3;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  int64_t extraout_RDX_01;
  int64_t extraout_RDX_02;
  int64_t iVar4;
  hugeint_t value;
  hugeint_t value_00;
  hugeint_t value_01;
  
  if (this->compression_buffer_idx == 0) {
    return true;
  }
  if (((this->all_invalid != false) ||
      (bVar1 = hugeint_t::operator==(&this->maximum,&this->minimum), bVar1)) &&
     ((byte)(this->mode - AUTO) < 2)) {
    this->total_size = this->total_size + 0x14;
    return true;
  }
  CalculateFORStats(this);
  CalculateDeltaStats(this);
  iVar4 = extraout_RDX;
  if (this->can_do_delta == true) {
    bVar1 = hugeint_t::operator==(&this->maximum_delta,&this->minimum_delta);
    if ((bVar1) && ((this->mode & ~AUTO) != DELTA_FOR)) {
      this->total_size = this->total_size + 0x24;
      return true;
    }
    value.upper = extraout_RDX_00;
    value.lower = (this->min_max_delta_diff).upper;
    width = BitpackingPrimitives::MinimumBitWidth<duckdb::hugeint_t,false>
                      ((BitpackingPrimitives *)(this->min_max_delta_diff).lower,value);
    value_00.upper = extraout_RDX_01;
    value_00.lower = (this->min_max_diff).upper;
    bVar2 = BitpackingPrimitives::MinimumBitWidth<duckdb::hugeint_t,true>
                      ((BitpackingPrimitives *)(this->min_max_diff).lower,value_00);
    iVar4 = extraout_RDX_02;
    if ((width < bVar2) && (this->mode != FOR)) {
      SubtractFrameOfReference<duckdb::hugeint_t>(this,this->delta_buffer,this->minimum_delta);
      this->total_size = this->total_size + 0x28;
      iVar3 = BitpackingPrimitives::GetRequiredSize(this->compression_buffer_idx,width);
      this->total_size = this->total_size + iVar3;
      return true;
    }
  }
  bVar1 = this->can_do_for == true;
  if (bVar1) {
    value_01.upper = iVar4;
    value_01.lower = (this->min_max_diff).upper;
    width_00 = BitpackingPrimitives::MinimumBitWidth<duckdb::hugeint_t,false>
                         ((BitpackingPrimitives *)(this->min_max_diff).lower,value_01);
    SubtractFrameOfReference<duckdb::hugeint_t>(this,this->compression_buffer,this->minimum);
    iVar3 = BitpackingPrimitives::GetRequiredSize(this->compression_buffer_idx,width_00);
    this->total_size = iVar3 + this->total_size + 0x18;
  }
  return bVar1;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}